

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gla_ManExplorePPis(Gla_Man_t *p,Vec_Int_t *vPPis)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gla_Obj_t *pObj;
  Gla_Obj_t *pGVar4;
  int i;
  ulong uVar5;
  
  iVar1 = Gla_ManExplorePPis::Round;
  Gla_ManExplorePPis::Round = Gla_ManExplorePPis::Round + 1;
  if (iVar1 % 5 == 0) {
    return;
  }
  i = 0;
  iVar1 = 0;
  while( true ) {
    if (vPPis->nSize <= i) {
      Vec_IntShrink(vPPis,iVar1);
      return;
    }
    iVar2 = Vec_IntEntry(vPPis,i);
    pObj = Gla_ManObj(p,iVar2);
    uVar3 = *(uint *)&pObj->field_0x4;
    if ((uVar3 & 1) != 0) break;
    iVar2 = 0;
    for (uVar5 = 0; uVar5 < uVar3 >> 9; uVar5 = uVar5 + 1) {
      pGVar4 = Gla_ManObj(p,pObj->Fanins[uVar5]);
      iVar2 = iVar2 + (*(uint *)&pGVar4->field_0x4 & 1);
      uVar3 = *(uint *)&pObj->field_0x4;
    }
    if ((iVar2 != 0) && (((Gla_ManExplorePPis::Round & 1U) == 0 || (iVar2 != 1)))) {
      iVar2 = Gla_ObjId(p,pObj);
      Vec_IntWriteEntry(vPPis,iVar1,iVar2);
      iVar1 = iVar1 + 1;
    }
    i = i + 1;
  }
  __assert_fail("pObj->fAbs == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                ,0x4fa,"void Gla_ManExplorePPis(Gla_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gla_ManExplorePPis( Gla_Man_t * p, Vec_Int_t * vPPis )
{
    static int Round = 0;
    Gla_Obj_t * pObj, * pFanin;
    int i, j, k, Count;
    if ( (Round++ % 5) == 0 )
        return;
    j = 0;
    Gla_ManForEachObjAbsVec( vPPis, p, pObj, i )
    {
        assert( pObj->fAbs == 0 );
        Count = 0;
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            Count += pFanin->fAbs;
        if ( Count == 0 || ((Round & 1) && Count == 1) )
            continue;
        Vec_IntWriteEntry( vPPis, j++, Gla_ObjId(p, pObj) );
    }
//    printf( "\n%d -> %d\n", Vec_IntSize(vPPis), j );
    Vec_IntShrink( vPPis, j );
}